

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::DescriptorScriptPubKeyMan::Encrypt
          (DescriptorScriptPubKeyMan *this,CKeyingMaterial *master_key,WalletBatch *batch)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  pointer __dest;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  uint256 *puVar10;
  mapped_type *pmVar11;
  size_t __n;
  long in_FS_OFFSET;
  byte bVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> crypted_secret;
  CKeyingMaterial secret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock56;
  CPubKey pubkey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_108;
  unique_lock<std::recursive_mutex> local_f0;
  CKeyID local_dc;
  uint256 local_c8 [2];
  uchar local_88;
  CPubKey local_79;
  long local_38;
  
  bVar12 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f0._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_f0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_f0);
  if ((this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    p_Var6 = (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_map_keys)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        CKey::GetPubKey(&local_79,(CKey *)&p_Var6[1]._M_right);
        lVar8 = *(long *)(p_Var6 + 2);
        local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,secure_allocator<unsigned_char>>::
        _M_range_initialize<unsigned_char_const*>
                  ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_108,lVar8,
                   (ulong)(lVar8 != 0) * 0x20 + lVar8);
        local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        CPubKey::GetHash(local_c8,&local_79);
        bVar4 = EncryptSecret(master_key,(CKeyingMaterial *)&local_108,local_c8,&local_128);
        if (!bVar4) {
          if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_128.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_128.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_128.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                    (&local_108);
          goto LAB_002223d5;
        }
        memcpy(local_c8,&local_79,0x41);
        uVar9 = (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (uVar9 == 0) {
          __dest = (pointer)0x0;
          __n = 0;
        }
        else {
          if ((long)uVar9 < 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar7 = std::__throw_bad_alloc();
              std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f0);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar7);
              }
            }
            goto LAB_002226d0;
          }
          __dest = (pointer)operator_new(uVar9);
          __n = (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        }
        if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          memmove(__dest,local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,__n);
        }
        CPubKey::GetID(&local_dc,&local_79);
        pmVar5 = std::
                 map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                 ::operator[](&this->m_map_crypted_keys,&local_dc);
        puVar10 = local_c8;
        pmVar11 = pmVar5;
        for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
          *(undefined8 *)(pmVar11->first).vch =
               *(undefined8 *)(puVar10->super_base_blob<256U>).m_data._M_elems;
          puVar10 = (uint256 *)((long)puVar10 + (ulong)bVar12 * -0x10 + 8);
          pmVar11 = (mapped_type *)((long)pmVar11 + (ulong)bVar12 * -0x10 + 8);
        }
        (pmVar5->first).vch[0x40] = local_88;
        puVar2 = (pmVar5->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (pmVar5->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pmVar5->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = __dest;
        (pmVar5->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest + __n;
        (pmVar5->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = __dest + uVar9;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2,(long)puVar3 - (long)puVar2);
        }
        (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(local_c8,this);
        WalletBatch::WriteCryptedDescriptorKey(batch,local_c8,&local_79,&local_128);
        if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_128.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                  (&local_108);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::clear(&(this->m_map_keys)._M_t);
    bVar4 = true;
  }
  else {
LAB_002223d5:
    bVar4 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
LAB_002226d0:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::Encrypt(const CKeyingMaterial& master_key, WalletBatch* batch)
{
    LOCK(cs_desc_man);
    if (!m_map_crypted_keys.empty()) {
        return false;
    }

    for (const KeyMap::value_type& key_in : m_map_keys)
    {
        const CKey &key = key_in.second;
        CPubKey pubkey = key.GetPubKey();
        CKeyingMaterial secret{UCharCast(key.begin()), UCharCast(key.end())};
        std::vector<unsigned char> crypted_secret;
        if (!EncryptSecret(master_key, secret, pubkey.GetHash(), crypted_secret)) {
            return false;
        }
        m_map_crypted_keys[pubkey.GetID()] = make_pair(pubkey, crypted_secret);
        batch->WriteCryptedDescriptorKey(GetID(), pubkey, crypted_secret);
    }
    m_map_keys.clear();
    return true;
}